

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O3

void __thiscall zmq::plain_server_t::~plain_server_t(plain_server_t *this)

{
  ~plain_server_t(this,&VTT);
  mechanism_t::~mechanism_t
            ((mechanism_t *)
             &(this->super_zap_client_common_handshake_t).super_zap_client_t.field_0x50);
  operator_delete(this,0x5e8);
  return;
}

Assistant:

zmq::plain_server_t::~plain_server_t ()
{
}